

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseAttValueInternal(xmlParserCtxtPtr ctxt,int *len,int *alloc,int normalize)

{
  xmlChar xVar1;
  byte *pbVar2;
  uint uVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlEntityPtr pxVar8;
  unsigned_long uVar9;
  byte *pbVar10;
  xmlChar *pxVar11;
  byte bVar12;
  xmlParserInputState xVar13;
  ulong uVar14;
  char *msg;
  int iVar15;
  ulong uVar16;
  xmlParserErrors error;
  long lVar17;
  int iVar18;
  xmlChar xVar19;
  byte *pbVar20;
  byte *pbVar21;
  byte *pbVar22;
  byte bVar23;
  long lVar24;
  bool bVar25;
  int local_5c;
  ulong local_58;
  byte *local_50;
  byte *local_48;
  int local_40;
  int local_3c;
  int *local_38;
  
  local_40 = normalize;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar4 = ctxt->input;
  pbVar21 = pxVar4->cur;
  iVar18 = pxVar4->line;
  if ((*pbVar21 != 0x22) && (*pbVar21 != 0x27)) goto LAB_0015d019;
  iVar15 = pxVar4->col;
  ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
  pbVar20 = pbVar21 + 1;
  bVar23 = *pbVar21;
  pbVar10 = pxVar4->end;
  xVar13 = XML_PARSER_ATTRIBUTE_VALUE;
  local_58 = CONCAT71(local_58._1_7_,bVar23);
  local_50 = (byte *)alloc;
  local_38 = len;
  if (pbVar10 <= pbVar20) {
    pxVar5 = pxVar4->base;
    if (((long)pbVar10 - (long)pbVar21 < 0xfa) && (ctxt->progressive == 0)) {
      xmlGROW(ctxt);
      xVar13 = ctxt->instate;
      bVar23 = (byte)local_58;
      if (xVar13 == XML_PARSER_EOF) {
        return (xmlChar *)0x0;
      }
    }
    pxVar4 = ctxt->input;
    pbVar10 = pxVar4->end;
    lVar17 = (long)pxVar4->base - (long)pxVar5;
    lVar24 = 0;
    if (lVar17 != 0) {
      lVar24 = lVar17;
    }
    pbVar20 = pbVar20 + lVar24;
  }
  iVar15 = iVar15 + 1;
  pbVar21 = pbVar20;
  if (local_40 != 0) {
    if (pbVar20 < pbVar10) {
      do {
        pbVar21 = pbVar20;
        if (((*pbVar20 == bVar23) || (uVar3 = (uint)*pbVar20, 0x20 < uVar3)) ||
           ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) break;
        iVar15 = iVar15 + 1;
        if (uVar3 == 10) {
          iVar15 = 1;
        }
        pbVar20 = pbVar20 + 1;
        if (pbVar10 <= pbVar20) {
          pxVar5 = pxVar4->base;
          if ((ctxt->progressive == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
            xmlGROW(ctxt);
            xVar13 = ctxt->instate;
            bVar23 = (byte)local_58;
          }
          if (xVar13 == XML_PARSER_EOF) {
            return (xmlChar *)0x0;
          }
          pxVar4 = ctxt->input;
          pbVar10 = pxVar4->end;
          lVar17 = (long)pxVar4->base - (long)pxVar5;
          lVar24 = 0;
          if (lVar17 != 0) {
            lVar24 = lVar17;
          }
          pbVar20 = pbVar20 + lVar24;
        }
        iVar18 = iVar18 + (uint)(uVar3 == 10);
        pbVar21 = pbVar20;
      } while (pbVar20 < pbVar10);
    }
    do {
      do {
        pbVar2 = pbVar21;
        if (((pbVar10 <= pbVar21) || (bVar12 = *pbVar21, (char)bVar12 < ' ' || bVar12 == bVar23)) ||
           ((bVar12 == 0x26 || (bVar12 == 0x3c)))) goto LAB_0015cd35;
        iVar15 = iVar15 + 1;
        pbVar21 = pbVar21 + 1;
        if ((bVar12 == 0x20) && (pbVar2 = pbVar21, *pbVar21 == 0x20)) goto LAB_0015cd35;
      } while (pbVar21 < pbVar10);
      pxVar5 = pxVar4->base;
      if ((ctxt->progressive == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
        xmlGROW(ctxt);
        xVar13 = ctxt->instate;
        bVar23 = (byte)local_58;
      }
      if (xVar13 == XML_PARSER_EOF) {
        return (xmlChar *)0x0;
      }
      pxVar4 = ctxt->input;
      pbVar10 = pxVar4->end;
      lVar17 = (long)pxVar4->base - (long)pxVar5;
      lVar24 = 0;
      if (lVar17 != 0) {
        lVar24 = lVar17;
      }
      pbVar20 = pbVar20 + lVar24;
      pbVar21 = pbVar21 + lVar24;
    } while (((long)pbVar21 - (long)pbVar20 < 0x989681) || ((ctxt->options & 0x80000) != 0));
LAB_0015cf70:
    xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
    return (xmlChar *)0x0;
  }
  while ((((pbVar21 < pbVar10 && (bVar12 = *pbVar21, '\x1f' < (char)bVar12 && bVar12 != bVar23)) &&
          (bVar12 != 0x26)) && (bVar12 != 0x3c))) {
    pbVar21 = pbVar21 + 1;
    if (pbVar10 <= pbVar21) {
      pxVar5 = pxVar4->base;
      if ((ctxt->progressive == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
        xmlGROW(ctxt);
        xVar13 = ctxt->instate;
        bVar23 = (byte)local_58;
      }
      if (xVar13 == XML_PARSER_EOF) {
        return (xmlChar *)0x0;
      }
      pxVar4 = ctxt->input;
      pbVar10 = pxVar4->end;
      lVar17 = (long)pxVar4->base - (long)pxVar5;
      lVar24 = 0;
      if (lVar17 != 0) {
        lVar24 = lVar17;
      }
      pbVar20 = pbVar20 + lVar24;
      pbVar21 = pbVar21 + lVar24;
      if ((10000000 < (long)pbVar21 - (long)pbVar20) && ((ctxt->options & 0x80000) == 0))
      goto LAB_0015cf70;
    }
    iVar15 = iVar15 + 1;
  }
  if ((10000000 < (long)pbVar21 - (long)pbVar20) && ((ctxt->options & 0x80000) == 0))
  goto LAB_0015cf70;
  pbVar22 = pbVar21;
  if (*pbVar21 == bVar23) goto LAB_0015ce71;
  goto LAB_0015cf93;
  while (pbVar2 = pbVar22 + -1, pbVar20 < pbVar22) {
LAB_0015cd35:
    pbVar22 = pbVar2;
    if (pbVar22[-1] != 0x20) break;
  }
  if (pbVar21 < pbVar10) {
    do {
      if (((*pbVar21 == bVar23) || (uVar3 = (uint)*pbVar21, 0x20 < uVar3)) ||
         ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) break;
      iVar15 = iVar15 + 1;
      if (uVar3 == 10) {
        iVar15 = 1;
      }
      pbVar21 = pbVar21 + 1;
      if (pbVar10 <= pbVar21) {
        pxVar5 = pxVar4->base;
        if ((ctxt->progressive == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
          local_48 = pbVar20;
          xmlGROW(ctxt);
          xVar13 = ctxt->instate;
          pbVar20 = local_48;
        }
        if (xVar13 == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        pxVar4 = ctxt->input;
        pbVar10 = pxVar4->end;
        lVar17 = (long)pxVar4->base - (long)pxVar5;
        lVar24 = 0;
        if (lVar17 != 0) {
          lVar24 = lVar17;
        }
        pbVar22 = pbVar22 + lVar24;
        pbVar20 = pbVar20 + lVar24;
        pbVar21 = pbVar21 + lVar24;
        bVar23 = (byte)local_58;
        if ((10000000 < (long)pbVar21 - (long)pbVar20) && ((ctxt->options & 0x80000) == 0))
        goto LAB_0015cf70;
      }
      iVar18 = iVar18 + (uint)(uVar3 == 10);
    } while (pbVar21 < pbVar10);
  }
  if ((10000000 < (long)pbVar21 - (long)pbVar20) && ((ctxt->options & 0x80000) == 0))
  goto LAB_0015cf70;
  if (*pbVar21 == bVar23) {
LAB_0015ce71:
    if (local_38 == (int *)0x0) {
      if (local_50 != (byte *)0x0) {
        local_50[0] = 1;
        local_50[1] = 0;
        local_50[2] = 0;
        local_50[3] = 0;
      }
      pbVar20 = xmlStrndup(pbVar20,(int)pbVar22 - (int)pbVar20);
      pxVar4 = ctxt->input;
    }
    else {
      *local_38 = (int)pbVar22 - (int)pbVar20;
    }
    pxVar4->cur = pbVar21 + 1;
    pxVar4->line = iVar18;
    pxVar4->col = iVar15 + 1;
    if (local_50 != (byte *)0x0) {
      local_50[0] = 0;
      local_50[1] = 0;
      local_50[2] = 0;
      local_50[3] = 0;
      return pbVar20;
    }
    return pbVar20;
  }
LAB_0015cf93:
  if (local_50 != (byte *)0x0) {
    local_50[0] = 1;
    local_50[1] = 0;
    local_50[2] = 0;
    local_50[3] = 0;
  }
  xVar19 = *pxVar4->cur;
  if (xVar19 != '\"') {
    if (xVar19 != '\'') {
LAB_0015d019:
      xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    xVar19 = '\'';
  }
  ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
  xmlNextChar(ctxt);
  pxVar5 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (pxVar5 == (xmlChar *)0x0) {
    local_50 = (byte *)0x0;
    pxVar5 = (xmlChar *)0x0;
  }
  else {
    uVar3 = xmlCurrentChar(ctxt,&local_5c);
    pxVar6 = ctxt->input->cur;
    bVar25 = false;
    if (xVar19 == *pxVar6) {
      uVar16 = 0;
    }
    else {
      local_50 = (byte *)0x0;
      pbVar21 = (byte *)0x64;
      uVar16 = 0;
      local_58 = 0;
      do {
        if ((int)uVar3 < 0x100) {
          if ((int)uVar3 < 0x20) {
            if ((0xd < uVar3) || ((0x2600U >> (uVar3 & 0x1f) & 1) == 0)) break;
          }
          else if (uVar3 == 0x3c) {
            uVar3 = 0x3c;
            break;
          }
        }
        else if ((uVar3 - 0x110000 < 0xfff00000 && uVar3 - 0xfffe < 0xffffe002) && 0xd7ff < uVar3)
        break;
        if (ctxt->instate == XML_PARSER_EOF) break;
        if ((10000000 < uVar16) && ((ctxt->options & 0x80000) == 0)) goto LAB_0015d8a5;
        pxVar7 = pxVar5;
        pbVar20 = pbVar21;
        if (uVar3 < 0x27) {
          if ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
            if ((local_40 == 0) || (uVar16 != 0)) {
              bVar25 = (int)local_58 == 0;
              local_58 = 1;
              if (local_40 == 0 || bVar25) {
                if (local_5c == 1) {
                  pxVar5[uVar16] = ' ';
                  uVar16 = uVar16 + 1;
                }
                else {
                  iVar18 = xmlCopyCharMultiByte(pxVar5 + uVar16,0x20);
                  uVar16 = uVar16 + (long)iVar18;
                }
                while (pbVar20 < (byte *)(uVar16 + 10)) {
                  pbVar21 = (byte *)((long)pbVar20 * 2 + 10);
                  pxVar5 = pxVar7;
                  if ((pbVar21 < pbVar20) ||
                     (pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar7,(size_t)pbVar21), pbVar20 = pbVar21,
                     pxVar7 == (xmlChar *)0x0)) goto LAB_0015d8c4;
                }
              }
            }
            else {
              uVar16 = 0;
            }
            goto LAB_0015d3c8;
          }
          if ((ulong)uVar3 != 0x26) goto LAB_0015d236;
          if (pxVar6[1] == '#') {
            uVar3 = xmlParseCharRef(ctxt);
            uVar14 = (ulong)uVar3;
            if (uVar3 != 0) {
              pbVar20 = (byte *)(uVar16 + 10);
              if (uVar3 == 0x26) {
                pxVar6 = pxVar5;
                if (ctxt->replaceEntities == 0) {
                  if ((pbVar21 < pbVar20) &&
                     ((pbVar20 = (byte *)((long)pbVar21 * 2 + 10), pbVar20 < pbVar21 ||
                      (pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar5,(size_t)pbVar20), pbVar21 = pbVar20,
                      pxVar6 == (xmlChar *)0x0)))) goto LAB_0015d8c4;
                  builtin_memcpy(pxVar6 + uVar16,"&#38;",5);
                  uVar16 = uVar16 + 5;
                }
                else {
                  if ((pbVar21 < pbVar20) &&
                     ((pbVar20 = (byte *)((long)pbVar21 * 2 + 10), pbVar20 < pbVar21 ||
                      (pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar5,(size_t)pbVar20), pbVar21 = pbVar20,
                      pxVar6 == (xmlChar *)0x0)))) goto LAB_0015d8c4;
                  pxVar6[uVar16] = '&';
                  uVar16 = uVar16 + 1;
                }
                local_58 = 0;
                pxVar5 = pxVar6;
                uVar14 = local_58;
              }
              else {
                pxVar6 = pxVar5;
                pbVar10 = pbVar21;
                if ((pbVar21 < pbVar20) &&
                   ((pbVar10 = (byte *)((long)pbVar21 * 2 + 10), pbVar10 < pbVar21 ||
                    (pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar5,(size_t)pbVar10),
                    pxVar6 == (xmlChar *)0x0)))) goto LAB_0015d8c4;
                iVar18 = xmlCopyChar(0,pxVar6 + uVar16,uVar3);
                uVar16 = uVar16 + (long)iVar18;
                local_58 = 0;
                pxVar5 = pxVar6;
                pbVar21 = pbVar10;
                uVar14 = local_58;
              }
            }
          }
          else {
            pxVar8 = xmlParseEntityRef(ctxt);
            uVar9 = ctxt->nbentities + 1;
            ctxt->nbentities = uVar9;
            local_58 = 0;
            uVar14 = local_58;
            if (pxVar8 != (xmlEntityPtr)0x0) {
              ctxt->nbentities = uVar9 + (long)pxVar8->owner;
              if (pxVar8->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
                pxVar6 = pxVar5;
                if ((pbVar21 < (byte *)(uVar16 + 10)) &&
                   ((pbVar20 = (byte *)((long)pbVar21 * 2 + 10), pbVar20 < pbVar21 ||
                    (pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar5,(size_t)pbVar20), pbVar21 = pbVar20,
                    pxVar6 == (xmlChar *)0x0)))) goto LAB_0015d8c4;
                pxVar5 = pxVar6;
                uVar14 = local_58;
                if (*pxVar8->content == '&' && ctxt->replaceEntities == 0) {
                  builtin_memcpy(pxVar6 + uVar16,"&#38;",5);
                  uVar16 = uVar16 + 5;
                }
                else {
                  pxVar6[uVar16] = *pxVar8->content;
                  uVar16 = uVar16 + 1;
                }
              }
              else if (ctxt->replaceEntities == 0) {
                local_3c = xmlStrlen(pxVar8->name);
                pxVar6 = pxVar8->name;
                if (((pxVar8->etype != XML_INTERNAL_PREDEFINED_ENTITY) &&
                    (pxVar7 = pxVar8->content, pxVar7 != (xmlChar *)0x0)) && (pxVar8->checked == 0))
                {
                  local_48 = (byte *)ctxt->nbentities;
                  ctxt->depth = ctxt->depth + 1;
                  iVar18 = xmlStrlen(pxVar7);
                  pxVar7 = xmlStringLenDecodeEntities(ctxt,pxVar7,iVar18,1,'\0','\0','\0');
                  ctxt->depth = ctxt->depth + -1;
                  uVar14 = (ctxt->nbentities - (long)local_48) + 1;
                  if (0x3ffffffe < uVar14) {
                    uVar14 = 0x3fffffff;
                  }
                  pxVar8->checked = (int)uVar14 * 2;
                  if (pxVar7 == (xmlChar *)0x0) {
                    *pxVar8->content = '\0';
                  }
                  else {
                    pxVar11 = xmlStrchr(pxVar7,'<');
                    if (pxVar11 != (xmlChar *)0x0) {
                      *(byte *)&pxVar8->checked = (byte)pxVar8->checked | 1;
                    }
                    (*xmlFree)(pxVar7);
                  }
                }
                lVar24 = uVar16 + 1;
                pxVar5[uVar16] = '&';
                lVar17 = (long)local_3c;
                local_48 = (byte *)(lVar17 + uVar16 + 0xb);
                pxVar7 = pxVar5;
                while (pxVar5 = pxVar7, pbVar21 < local_48) {
                  pbVar20 = (byte *)((long)pbVar21 * 2 + lVar17 + 10);
                  if ((pbVar20 < pbVar21) ||
                     (pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar5,(size_t)pbVar20), pbVar21 = pbVar20,
                     pxVar7 == (xmlChar *)0x0)) goto LAB_0015d8c4;
                }
                if (0 < local_3c) {
                  uVar3 = local_3c + 1;
                  do {
                    xVar1 = *pxVar6;
                    pxVar6 = pxVar6 + 1;
                    pxVar5[lVar24] = xVar1;
                    lVar24 = lVar24 + 1;
                    uVar3 = uVar3 - 1;
                  } while (1 < uVar3);
                }
                pxVar5[lVar24] = ';';
                uVar16 = lVar24 + 1;
                uVar14 = local_58;
              }
              else {
                ctxt->depth = ctxt->depth + 1;
                local_58 = 0;
                pbVar10 = xmlStringDecodeEntities(ctxt,pxVar8->content,1,'\0','\0','\0');
                ctxt->depth = ctxt->depth + -1;
                uVar14 = local_58;
                pbVar20 = pbVar10;
                if (pbVar10 != (byte *)0x0) {
                  while( true ) {
                    pxVar6 = pxVar5;
                    local_48 = pbVar20;
                    bVar23 = *pbVar10;
                    bVar12 = 0x20;
                    pxVar5 = pxVar6;
                    if (((1 < bVar23 - 9) && (bVar23 != 0xd)) && (bVar12 = bVar23, bVar23 == 0))
                    break;
                    pxVar6[uVar16] = bVar12;
                    uVar14 = uVar16 + 1;
                    pbVar10 = pbVar10 + 1;
                    pbVar22 = (byte *)(uVar16 + 0xb);
                    uVar16 = uVar14;
                    pbVar20 = local_48;
                    if ((pbVar21 < pbVar22) &&
                       ((pbVar22 = (byte *)((long)pbVar21 * 2 + 10), pbVar22 < pbVar21 ||
                        (pxVar5 = (xmlChar *)(*xmlRealloc)(pxVar6,(size_t)pbVar22),
                        pbVar20 = local_48, pbVar21 = pbVar22, pxVar5 == (xmlChar *)0x0)))) {
                      local_50 = local_48;
                      pxVar5 = pxVar6;
                      goto LAB_0015d8c4;
                    }
                  }
                  (*xmlFree)(local_48);
                  uVar14 = local_58;
                }
              }
            }
          }
        }
        else {
LAB_0015d236:
          if (local_5c == 1) {
            pxVar5[uVar16] = (xmlChar)uVar3;
            uVar16 = uVar16 + 1;
          }
          else {
            iVar18 = xmlCopyCharMultiByte(pxVar5 + uVar16,uVar3);
            uVar16 = uVar16 + (long)iVar18;
          }
          if (pbVar21 < (byte *)(uVar16 + 10)) {
            pbVar20 = (byte *)((long)pbVar21 * 2 + 10);
            if (pbVar20 < pbVar21) goto LAB_0015d8c4;
            pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar5,(size_t)pbVar20);
            if (pxVar7 == (xmlChar *)0x0) {
              local_50 = (byte *)0x0;
              goto LAB_0015d8c4;
            }
            local_58 = 0;
          }
          else {
            local_58 = 0;
          }
LAB_0015d3c8:
          pxVar4 = ctxt->input;
          if (*pxVar4->cur == '\n') {
            pxVar4->line = pxVar4->line + 1;
            pxVar4->col = 1;
          }
          else {
            pxVar4->col = pxVar4->col + 1;
          }
          pxVar4->cur = pxVar4->cur + local_5c;
          pxVar5 = pxVar7;
          pbVar21 = pbVar20;
          uVar14 = local_58;
        }
        local_58 = uVar14;
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        uVar3 = xmlCurrentChar(ctxt,&local_5c);
        pxVar6 = ctxt->input->cur;
      } while (xVar19 != *pxVar6);
      bVar25 = (int)local_58 != 0;
    }
    if (ctxt->instate == XML_PARSER_EOF) {
      pbVar21 = (byte *)0x0;
      goto LAB_0015d8d3;
    }
    if ((bVar25 && local_40 != 0) && (uVar16 != 0)) {
      do {
        if (pxVar5[uVar16 - 1] != ' ') goto LAB_0015d81c;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
      uVar16 = 0;
    }
LAB_0015d81c:
    pxVar5[uVar16] = '\0';
    xVar1 = *ctxt->input->cur;
    if (xVar1 == '<') {
      xmlFatalErr(ctxt,XML_ERR_LT_IN_ATTRIBUTE,(char *)0x0);
    }
    else if (xVar19 == xVar1) {
      xmlNextChar(ctxt);
    }
    else {
      if (uVar3 == 0) {
LAB_0015d883:
        msg = "AttValue: \' expected\n";
        error = XML_ERR_ATTRIBUTE_NOT_FINISHED;
      }
      else {
        if ((int)uVar3 < 0x100) {
          if ((0x1f < (int)uVar3) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0))))
          goto LAB_0015d883;
        }
        else if (uVar3 - 0x10000 < 0x100000 || (uVar3 - 0xe000 < 0x1ffe || uVar3 < 0xd800))
        goto LAB_0015d883;
        msg = "invalid character in attribute value\n";
        error = XML_ERR_INVALID_CHAR;
      }
      xmlFatalErrMsg(ctxt,error,msg);
    }
    if (uVar16 < 0x7fffffff) {
      if (local_38 != (int *)0x0) {
        *local_38 = (int)uVar16;
        return pxVar5;
      }
      return pxVar5;
    }
LAB_0015d8a5:
    xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
    local_50 = (byte *)0x0;
  }
LAB_0015d8c4:
  xmlErrMemory(ctxt,(char *)0x0);
  pbVar21 = local_50;
LAB_0015d8d3:
  if (pxVar5 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar5);
  }
  if (pbVar21 == (byte *)0x0) {
    return (xmlChar *)0x0;
  }
  (*xmlFree)(pbVar21);
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlParseAttValueInternal(xmlParserCtxtPtr ctxt, int *len, int *alloc,
                         int normalize)
{
    xmlChar limit = 0;
    const xmlChar *in = NULL, *start, *end, *last;
    xmlChar *ret = NULL;
    int line, col;

    GROW;
    in = (xmlChar *) CUR_PTR;
    line = ctxt->input->line;
    col = ctxt->input->col;
    if (*in != '"' && *in != '\'') {
        xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
        return (NULL);
    }
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;

    /*
     * try to handle in this routine the most common case where no
     * allocation of a new string is required and where content is
     * pure ASCII.
     */
    limit = *in++;
    col++;
    end = ctxt->input->end;
    start = in;
    if (in >= end) {
        GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
    }
    if (normalize) {
        /*
	 * Skip any leading spaces
	 */
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++; col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    start = in;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    col++;
	    if ((*in++ == 0x20) && (*in == 0x20)) break;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
	/*
	 * skip the trailing blanks
	 */
	while ((last[-1] == 0x20) && (last > start)) last--;
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++, col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    if (in >= end) {
		const xmlChar *oldbase = ctxt->input->base;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(NULL);
		if (oldbase != ctxt->input->base) {
		    ptrdiff_t delta = ctxt->input->base - oldbase;
		    start = start + delta;
		    in = in + delta;
		    last = last + delta;
		}
		end = ctxt->input->end;
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
        if (((in - start) > XML_MAX_TEXT_LENGTH) &&
            ((ctxt->options & XML_PARSE_HUGE) == 0)) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    } else {
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    in++;
	    col++;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
        if (((in - start) > XML_MAX_TEXT_LENGTH) &&
            ((ctxt->options & XML_PARSE_HUGE) == 0)) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    }
    in++;
    col++;
    if (len != NULL) {
        *len = last - start;
        ret = (xmlChar *) start;
    } else {
        if (alloc) *alloc = 1;
        ret = xmlStrndup(start, last - start);
    }
    CUR_PTR = in;
    ctxt->input->line = line;
    ctxt->input->col = col;
    if (alloc) *alloc = 0;
    return ret;
need_complex:
    if (alloc) *alloc = 1;
    return xmlParseAttValueComplex(ctxt, len, normalize);
}